

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O2

bool __thiscall
cmVariableWatch::AddWatch
          (cmVariableWatch *this,string *variable,WatchMethod method,void *client_data,
          DeleteData delete_data)

{
  pointer ppPVar1;
  Pair *pPVar2;
  mapped_type *this_00;
  ulong uVar3;
  ulong uVar4;
  Pair *p;
  
  p = (Pair *)operator_new(0x18);
  p->Method = method;
  p->ClientData = client_data;
  p->DeleteDataCall = delete_data;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
            ::operator[](&this->WatchMap,variable);
  ppPVar1 = (this_00->
            super__Vector_base<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this_00->
                super__Vector_base<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3;
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    if (((client_data != (void *)0x0) && (pPVar2 = ppPVar1[uVar3], pPVar2->Method == method)) &&
       (pPVar2->ClientData == client_data)) goto LAB_002baa97;
  }
  std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>::push_back
            (this_00,&p);
LAB_002baa97:
  return uVar4 <= uVar3;
}

Assistant:

bool cmVariableWatch::AddWatch(const std::string& variable,
                               WatchMethod method, void* client_data /*=0*/,
                               DeleteData delete_data /*=0*/)
{
  cmVariableWatch::Pair* p = new cmVariableWatch::Pair;
  p->Method = method;
  p->ClientData = client_data;
  p->DeleteDataCall = delete_data;
  cmVariableWatch::VectorOfPairs* vp = &this->WatchMap[variable];
  cmVariableWatch::VectorOfPairs::size_type cc;
  for ( cc = 0; cc < vp->size(); cc ++ )
    {
    cmVariableWatch::Pair* pair = (*vp)[cc];
    if ( pair->Method == method &&
         client_data && client_data == pair->ClientData)
      {
      // Callback already exists
      return false;
      }
    }
  vp->push_back(p);
  return true;
}